

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O0

void glmc_euler_yzx(float *angles,vec4 *dest)

{
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float cxsy;
  float cysx;
  float cxcy;
  float sxsy;
  float sz;
  float sy;
  float sx;
  float cz;
  float cy;
  float cx;
  
  fVar1 = sinf(*in_RDI);
  fVar2 = cosf(*in_RDI);
  fVar3 = sinf(in_RDI[1]);
  fVar4 = cosf(in_RDI[1]);
  fVar5 = sinf(in_RDI[2]);
  fVar6 = cosf(in_RDI[2]);
  *in_RSI = fVar4 * fVar6;
  in_RSI[1] = fVar5;
  in_RSI[2] = -fVar6 * fVar3;
  in_RSI[4] = -(fVar2 * fVar4) * fVar5 + fVar1 * fVar3;
  in_RSI[5] = fVar2 * fVar6;
  in_RSI[6] = fVar2 * fVar3 * fVar5 + fVar4 * fVar1;
  in_RSI[8] = fVar4 * fVar1 * fVar5 + fVar2 * fVar3;
  in_RSI[9] = -fVar6 * fVar1;
  in_RSI[10] = -(fVar1 * fVar3) * fVar5 + fVar2 * fVar4;
  in_RSI[3] = 0.0;
  in_RSI[7] = 0.0;
  in_RSI[0xb] = 0.0;
  in_RSI[0xc] = 0.0;
  in_RSI[0xd] = 0.0;
  in_RSI[0xe] = 0.0;
  in_RSI[0xf] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_yzx(vec3 angles, mat4 dest) {
  glm_euler_yzx(angles, dest);
}